

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::MidSideNodeIndex
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,int side,int64_t *index)

{
  int iVar1;
  int64_t iVar2;
  ostream *poVar3;
  
  *index = -1;
  if (-1 < side) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xf0))();
    if (side < iVar1) {
      iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
      if (side < iVar1) {
        iVar2 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xa8))(this,side);
        *index = iVar2;
      }
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::MidSideNodeIndex(int side,int64_t &index) const{
	//TRef::MidSideNodeIndex(this,side,index);
	index = -1;
	if(side<0 || side>NSides()-1) {
		PZError << "TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	if(side<NNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = NodeIndex(side);
		return;
	}
}